

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::parameterTypeCheck
          (TParseContext *this,TSourceLoc *loc,TStorageQualifier qualifier,TType *type)

{
  TIntermediate *pTVar1;
  int iVar2;
  TString TStack_48;
  
  if (((qualifier - EvqOut < 2) && (iVar2 = (*type->_vptr_TType[0x28])(type), (char)iVar2 != '\0'))
     && (pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
        (pTVar1->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
        (pTVar1->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
  {
    TType::getBasicTypeString_abi_cxx11_(&TStack_48,type);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"samplers and atomic_uints cannot be output parameters",
               TStack_48._M_dataplus._M_p,"");
  }
  if (((this->super_TParseContextBase).parsingBuiltins == false) &&
     (iVar2 = (*type->_vptr_TType[0x32])(type,3), (char)iVar2 != '\0')) {
    TType::getBasicTypeString_abi_cxx11_(&TStack_48,type);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
              (this,loc,TStack_48._M_dataplus._M_p,
               "float16 types can only be in uniform block or buffer storage");
  }
  if (((this->super_TParseContextBase).parsingBuiltins == false) &&
     ((iVar2 = (*type->_vptr_TType[0x32])(type,6), (char)iVar2 != '\0' ||
      (iVar2 = (*type->_vptr_TType[0x32])(type,7), (char)iVar2 != '\0')))) {
    TType::getBasicTypeString_abi_cxx11_(&TStack_48,type);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
              (this,loc,TStack_48._M_dataplus._M_p,
               "(u)int16 types can only be in uniform block or buffer storage");
  }
  if ((this->super_TParseContextBase).parsingBuiltins == false) {
    iVar2 = (*type->_vptr_TType[0x32])(type,4);
    if (((char)iVar2 == '\0') && (iVar2 = (*type->_vptr_TType[0x32])(type,5), (char)iVar2 == '\0'))
    {
      return;
    }
    TType::getBasicTypeString_abi_cxx11_(&TStack_48,type);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
              (this,loc,TStack_48._M_dataplus._M_p,
               "(u)int8 types can only be in uniform block or buffer storage");
  }
  return;
}

Assistant:

void TParseContext::parameterTypeCheck(const TSourceLoc& loc, TStorageQualifier qualifier, const TType& type)
{
    if ((qualifier == EvqOut || qualifier == EvqInOut) && type.isOpaque() && !intermediate.getBindlessMode())
        error(loc, "samplers and atomic_uints cannot be output parameters", type.getBasicTypeString().c_str(), "");
    if (!parsingBuiltins && type.contains16BitFloat())
        requireFloat16Arithmetic(loc, type.getBasicTypeString().c_str(), "float16 types can only be in uniform block or buffer storage");
    if (!parsingBuiltins && type.contains16BitInt())
        requireInt16Arithmetic(loc, type.getBasicTypeString().c_str(), "(u)int16 types can only be in uniform block or buffer storage");
    if (!parsingBuiltins && type.contains8BitInt())
        requireInt8Arithmetic(loc, type.getBasicTypeString().c_str(), "(u)int8 types can only be in uniform block or buffer storage");
}